

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcLoad.c
# Opt level: O0

int Bmc_LoadAddCnf(void *pMan,int iLit)

{
  Gia_Man_t *p_00;
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pObj_00;
  ulong uVar4;
  Gia_Obj_t *pObj;
  int iVar;
  int Lits [3];
  Bmc_Load_t *p;
  int iLit_local;
  void *pMan_local;
  
  Lits._4_8_ = pMan;
  pObj._0_4_ = Abc_Lit2Var(iLit);
  p_00 = *(Gia_Man_t **)(Lits._4_8_ + 8);
  iVar2 = Vec_IntEntry(*(Vec_Int_t **)(Lits._4_8_ + 0x18),(int)pObj);
  pObj_00 = Gia_ManObj(p_00,iVar2);
  *(int *)(Lits._4_8_ + 0x20) = *(int *)(Lits._4_8_ + 0x20) + 1;
  iVar2 = Gia_ObjIsCi(pObj_00);
  if ((iVar2 == 0) && (iVar2 = Gia_ObjIsConst0(pObj_00), iVar2 == 0)) {
    iVar2 = Gia_ObjIsAnd(pObj_00);
    if (iVar2 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcLoad.c"
                    ,0x4f,"int Bmc_LoadAddCnf(void *, int)");
    }
    iVar2 = Abc_LitIsCompl(iLit);
    if (iVar2 == 0) {
      uVar4 = *(ulong *)pObj_00 >> 0x1e;
    }
    else {
      uVar4 = *(ulong *)pObj_00 >> 0x3e;
    }
    if ((uVar4 & 1) == 0) {
      pObj._4_4_ = Abc_LitNot(iLit);
      iVar2 = Abc_LitIsCompl(iLit);
      uVar1 = Lits._4_8_;
      if (iVar2 == 0) {
        iVar2 = Gia_ObjFaninId0p(*(Gia_Man_t **)(Lits._4_8_ + 8),pObj_00);
        iVar2 = Bmc_LoadGetSatVar((Bmc_Load_t *)uVar1,iVar2);
        iVar3 = Gia_ObjFaninC0(pObj_00);
        iVar = Abc_Var2Lit(iVar2,iVar3);
        sat_solver_clause_new(*(sat_solver **)(Lits._4_8_ + 0x10),(lit *)((long)&pObj + 4),Lits,0);
        uVar1 = Lits._4_8_;
        iVar2 = Gia_ObjFaninId1p(*(Gia_Man_t **)(Lits._4_8_ + 8),pObj_00);
        iVar2 = Bmc_LoadGetSatVar((Bmc_Load_t *)uVar1,iVar2);
        iVar3 = Gia_ObjFaninC1(pObj_00);
        iVar = Abc_Var2Lit(iVar2,iVar3);
        sat_solver_clause_new(*(sat_solver **)(Lits._4_8_ + 0x10),(lit *)((long)&pObj + 4),Lits,0);
        *(ulong *)pObj_00 = *(ulong *)pObj_00 & 0xffffffffbfffffff | 0x40000000;
      }
      else {
        iVar2 = Gia_ObjFaninId0p(*(Gia_Man_t **)(Lits._4_8_ + 8),pObj_00);
        iVar2 = Bmc_LoadGetSatVar((Bmc_Load_t *)uVar1,iVar2);
        iVar3 = Gia_ObjFaninC0(pObj_00);
        iVar = Abc_Var2Lit(iVar2,(uint)((iVar3 != 0 ^ 0xffU) & 1));
        uVar1 = Lits._4_8_;
        iVar2 = Gia_ObjFaninId1p(*(Gia_Man_t **)(Lits._4_8_ + 8),pObj_00);
        iVar2 = Bmc_LoadGetSatVar((Bmc_Load_t *)uVar1,iVar2);
        iVar3 = Gia_ObjFaninC1(pObj_00);
        Lits[0] = Abc_Var2Lit(iVar2,(uint)((iVar3 != 0 ^ 0xffU) & 1));
        sat_solver_clause_new
                  (*(sat_solver **)(Lits._4_8_ + 0x10),(lit *)((long)&pObj + 4),Lits + 1,0);
        *(ulong *)pObj_00 = *(ulong *)pObj_00 & 0xbfffffffffffffff | 0x4000000000000000;
      }
      *(int *)(Lits._4_8_ + 0x24) = *(int *)(Lits._4_8_ + 0x24) + 1;
      pMan_local._4_4_ = 1;
    }
    else {
      pMan_local._4_4_ = 0;
    }
  }
  else {
    pMan_local._4_4_ = 0;
  }
  return pMan_local._4_4_;
}

Assistant:

int Bmc_LoadAddCnf( void * pMan, int iLit )
{
    Bmc_Load_t * p = (Bmc_Load_t *)pMan;
    int Lits[3], iVar = Abc_Lit2Var(iLit);
    Gia_Obj_t * pObj = Gia_ManObj( p->pGia, Vec_IntEntry(p->vSat2Id, iVar) );
    p->nCallBacks1++;
    if ( Gia_ObjIsCi(pObj) || Gia_ObjIsConst0(pObj) )
        return 0;
    assert( Gia_ObjIsAnd(pObj) );
    if ( (Abc_LitIsCompl(iLit) ? pObj->fMark1 : pObj->fMark0) )
        return 0;
    Lits[0] = Abc_LitNot(iLit);
    if ( Abc_LitIsCompl(iLit) )
    {
        Lits[1] = Abc_Var2Lit( Bmc_LoadGetSatVar(p, Gia_ObjFaninId0p(p->pGia, pObj)), !Gia_ObjFaninC0(pObj) );
        Lits[2] = Abc_Var2Lit( Bmc_LoadGetSatVar(p, Gia_ObjFaninId1p(p->pGia, pObj)), !Gia_ObjFaninC1(pObj) );
        sat_solver_clause_new( p->pSat, Lits, Lits + 3, 0 );
        pObj->fMark1 = 1;
    }
    else
    {
        Lits[1] = Abc_Var2Lit( Bmc_LoadGetSatVar(p, Gia_ObjFaninId0p(p->pGia, pObj)), Gia_ObjFaninC0(pObj) );
        sat_solver_clause_new( p->pSat, Lits, Lits + 2, 0 );
        Lits[1] = Abc_Var2Lit( Bmc_LoadGetSatVar(p, Gia_ObjFaninId1p(p->pGia, pObj)), Gia_ObjFaninC1(pObj) );
        sat_solver_clause_new( p->pSat, Lits, Lits + 2, 0 );
        pObj->fMark0 = 1;
    }
    p->nCallBacks2++;
    return 1;
}